

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O2

void __thiscall database::Container::~Container(Container *this)

{
  (this->m_data)._M_t.
  super___uniq_ptr_impl<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
        *)0x0;
  std::
  unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  ::~unique_ptr(&this->m_data);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
  ::~_Rb_tree(&(this->m_schema)._M_t);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

~Container() { m_data.release(); }